

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackNSISGenerator.cxx
# Opt level: O1

string * __thiscall
cmCPackNSISGenerator::CreateComponentGroupDescription_abi_cxx11_
          (string *__return_storage_ptr__,cmCPackNSISGenerator *this,cmCPackComponentGroup *group,
          ostream *macrosOut)

{
  pointer ppcVar1;
  pointer ppcVar2;
  cmCPackComponent *component;
  long *plVar3;
  undefined8 *puVar4;
  long *plVar5;
  size_type *psVar6;
  pointer ppcVar7;
  pointer ppcVar8;
  string local_c8;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  ostream *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  cmCPackComponentGroup *local_38;
  
  if (((group->Components).
       super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
       super__Vector_impl_data._M_start ==
       (group->Components).
       super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
       super__Vector_impl_data._M_finish) &&
     ((group->Subgroups).
      super__Vector_base<cmCPackComponentGroup_*,_std::allocator<cmCPackComponentGroup_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (group->Subgroups).
      super__Vector_base<cmCPackComponentGroup_*,_std::allocator<cmCPackComponentGroup_*>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    local_68 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_68;
    local_60 = macrosOut;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"SectionGroup ","");
    if ((group->field_0x60 & 2) != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    if ((group->field_0x60 & 1) == 0) {
      std::operator+(&local_58,"\"",&group->DisplayName);
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_58);
      local_a8 = &local_98;
      plVar3 = puVar4 + 2;
      if ((long *)*puVar4 == plVar3) {
        local_98 = *plVar3;
        lStack_90 = puVar4[3];
      }
      else {
        local_98 = *plVar3;
        local_a8 = (long *)*puVar4;
      }
      local_a0 = puVar4[1];
      *puVar4 = plVar3;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      puVar4 = (undefined8 *)
               std::__cxx11::string::_M_append
                         ((char *)&local_a8,(ulong)(group->Name)._M_dataplus._M_p);
      local_88 = &local_78;
      plVar3 = puVar4 + 2;
      if ((long *)*puVar4 == plVar3) {
        local_78 = *plVar3;
        lStack_70 = puVar4[3];
      }
      else {
        local_78 = *plVar3;
        local_88 = (long *)*puVar4;
      }
      local_80 = puVar4[1];
      *puVar4 = plVar3;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_88);
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      psVar6 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_c8.field_2._M_allocated_capacity = *psVar6;
        local_c8.field_2._8_8_ = plVar3[3];
      }
      else {
        local_c8.field_2._M_allocated_capacity = *psVar6;
        local_c8._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_c8._M_string_length = plVar3[1];
      *plVar3 = (long)psVar6;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_c8._M_dataplus._M_p);
    }
    else {
      std::operator+(&local_58,"\"!",&group->DisplayName);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_58);
      local_a8 = &local_98;
      plVar5 = plVar3 + 2;
      if ((long *)*plVar3 == plVar5) {
        local_98 = *plVar5;
        lStack_90 = plVar3[3];
      }
      else {
        local_98 = *plVar5;
        local_a8 = (long *)*plVar3;
      }
      local_a0 = plVar3[1];
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_a8,(ulong)(group->Name)._M_dataplus._M_p);
      local_88 = &local_78;
      plVar5 = plVar3 + 2;
      if ((long *)*plVar3 == plVar5) {
        local_78 = *plVar5;
        lStack_70 = plVar3[3];
      }
      else {
        local_78 = *plVar5;
        local_88 = (long *)*plVar3;
      }
      local_80 = plVar3[1];
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_88);
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      psVar6 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_c8.field_2._M_allocated_capacity = *psVar6;
        local_c8.field_2._8_8_ = plVar3[3];
      }
      else {
        local_c8.field_2._M_allocated_capacity = *psVar6;
        local_c8._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_c8._M_string_length = plVar3[1];
      *plVar3 = (long)psVar6;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_c8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if (local_88 != &local_78) {
      operator_delete(local_88,local_78 + 1);
    }
    if (local_a8 != &local_98) {
      operator_delete(local_a8,local_98 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    ppcVar7 = (group->Subgroups).
              super__Vector_base<cmCPackComponentGroup_*,_std::allocator<cmCPackComponentGroup_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppcVar1 = (group->Subgroups).
              super__Vector_base<cmCPackComponentGroup_*,_std::allocator<cmCPackComponentGroup_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    local_38 = group;
    if (ppcVar7 != ppcVar1) {
      do {
        CreateComponentGroupDescription_abi_cxx11_(&local_c8,this,*ppcVar7,local_60);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_c8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        ppcVar7 = ppcVar7 + 1;
      } while (ppcVar7 != ppcVar1);
    }
    ppcVar8 = (local_38->Components).
              super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppcVar2 = (local_38->Components).
              super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppcVar8 != ppcVar2) {
      do {
        component = *ppcVar8;
        if ((component->Files).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (component->Files).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          CreateComponentDescription_abi_cxx11_(&local_c8,this,component,local_60);
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_c8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
        }
        ppcVar8 = ppcVar8 + 1;
      } while (ppcVar8 != ppcVar2);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackNSISGenerator::CreateComponentGroupDescription(
  cmCPackComponentGroup* group, std::ostream& macrosOut)
{
  if (group->Components.empty() && group->Subgroups.empty()) {
    // Silently skip empty groups. NSIS doesn't support them.
    return std::string();
  }

  std::string code = "SectionGroup ";
  if (group->IsExpandedByDefault) {
    code += "/e ";
  }
  if (group->IsBold) {
    code += "\"!" + group->DisplayName + "\" " + group->Name + "\n";
  } else {
    code += "\"" + group->DisplayName + "\" " + group->Name + "\n";
  }

  for (cmCPackComponentGroup* g : group->Subgroups) {
    code += this->CreateComponentGroupDescription(g, macrosOut);
  }

  for (cmCPackComponent* comp : group->Components) {
    if (comp->Files.empty()) {
      continue;
    }

    code += this->CreateComponentDescription(comp, macrosOut);
  }
  code += "SectionGroupEnd\n";
  return code;
}